

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_floating<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer puVar4;
  element_type *peVar5;
  long *plVar6;
  undefined1 *__dest;
  int iVar7;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var9;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_RCX;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  error_info *v;
  basic_value<toml::type_config> *v_00;
  scanner_storage *other;
  success_type sVar10;
  long lVar11;
  basic_value<toml::type_config> *ctx_00;
  _Alloc_hider _Var12;
  undefined8 unaff_R12;
  bool bVar13;
  undefined4 uVar14;
  uint uVar15;
  undefined4 uVar16;
  string str;
  result<double,_toml::error_info> res;
  source_location src;
  region reg;
  location first;
  floating_type local_8e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *local_8b8;
  undefined4 local_8ac;
  floating_format local_8a8;
  undefined7 uStack_8a7;
  char *pcStack_8a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_898;
  undefined1 local_878 [8];
  undefined1 local_870 [96];
  undefined1 local_810 [8];
  undefined1 auStack_808 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7f0 [2];
  undefined8 local_7d0;
  undefined1 local_7c8 [24];
  pointer local_7b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_7a8 [4];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_760;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_688;
  floating_format_info local_668;
  region local_638;
  location local_5c8;
  string local_580;
  sequence local_560;
  undefined1 local_540 [16];
  undefined1 local_530 [40];
  _Alloc_hider local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8 [2];
  source_location local_4d8;
  character local_458;
  character local_448;
  region_type local_438;
  location local_3c8;
  location local_380;
  source_location local_338;
  region local_2c0;
  failure<toml::error_info> local_258;
  basic_value<toml::type_config> local_200;
  failure<toml::error_info> local_138;
  failure<toml::error_info> local_e0;
  failure<toml::error_info> local_88;
  
  local_8b8 = __return_storage_ptr__;
  location::location(&local_5c8,loc);
  local_8d8._M_dataplus._M_p = (pointer)&local_8d8.field_2;
  local_8d8._M_string_length = 0;
  local_8d8.field_2._M_local_buf[0] = '\0';
  region::region(&local_638);
  bVar13 = (ctx->toml_spec_).ext_hex_float;
  if (bVar13 == true) {
    local_448.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005687c8;
    local_448.value_ = '0';
    local_458.super_scanner_base._vptr_scanner_base = (_func_int **)&PTR__scanner_base_005687c8;
    local_458.value_ = 'x';
    sequence::sequence<toml::detail::character,toml::detail::character>
              (&local_560,&local_448,&local_458);
    sequence::scan(&local_2c0,&local_560,loc);
    uVar14 = (undefined4)
             CONCAT71((int7)((ulong)unaff_R12 >> 8),
                      local_2c0.source_.
                      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr != (element_type *)0x0);
  }
  else {
    uVar14 = 0;
  }
  if (bVar13 != false) {
    region::~region(&local_2c0);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector(&local_560.others_);
  }
  if ((char)uVar14 == '\0') {
    local_8ac = uVar14;
    syntax::floating((either *)local_878,&ctx->toml_spec_);
    bVar13 = local_870._0_8_ == local_870._8_8_;
    if (!bVar13) {
      sVar10.value = (value_type_conflict3)local_870._0_8_;
      do {
        (**(code **)(*(long *)*(unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                                *)sVar10.value + 0x10))
                  ((region *)local_810,
                   (__uniq_ptr_data<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>,_true,_true>
                    )*(unique_ptr<toml::detail::scanner_base,_std::default_delete<toml::detail::scanner_base>_>
                       *)sVar10.value,loc);
        if (CONCAT71(local_810._1_7_,local_810[0]) != 0) {
          if (!bVar13) goto LAB_003d8b1f;
          break;
        }
        region::~region((region *)local_810);
        sVar10.value = sVar10.value + 8;
        bVar13 = sVar10.value == (value_type_conflict3)local_870._8_8_;
      } while (!bVar13);
    }
    region::region((region *)local_810);
LAB_003d8b1f:
    region::operator=(&local_638,(region *)local_810);
    region::~region((region *)local_810);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )local_870);
    if (local_638.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      puVar4 = ((local_638.source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_start;
      make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (&local_580,(detail *)(puVar4 + local_638.first_),
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(puVar4 + local_638.last_),in_RCX);
      parse_floating<toml::type_config>();
      uVar14 = local_8ac;
      goto LAB_003d8d87;
    }
    local_6e8._M_dataplus._M_p = (pointer)&local_6e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_6e8,
               "toml::parse_floating: invalid floating: float must be like: -3.14159_26535, 6.022e+23, inf, or nan (lowercase)."
               ,"");
    syntax::floating((either *)local_878,&ctx->toml_spec_);
    location::location(&local_3c8,loc);
    local_708._M_dataplus._M_p = (pointer)&local_708.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_708,"");
    make_syntax_error<toml::detail::either>
              ((error_info *)local_810,&local_6e8,(either *)local_878,&local_3c8,&local_708);
    err<toml::error_info>(&local_e0,(error_info *)local_810);
    local_8b8->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(local_8b8->field_1).succ_,&local_e0);
    failure<toml::error_info>::~failure(&local_e0);
    if ((undefined1 *)CONCAT44(local_7f0[1]._12_4_,local_7f0[1]._8_4_) != local_7c8) {
      operator_delete((undefined1 *)CONCAT44(local_7f0[1]._12_4_,local_7f0[1]._8_4_),
                      local_7c8._0_8_ + 1);
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_7f0);
    if ((undefined1 *)CONCAT71(local_810._1_7_,local_810[0]) != auStack_808 + 8) {
      operator_delete((undefined1 *)CONCAT71(local_810._1_7_,local_810[0]),
                      CONCAT44(auStack_808._12_4_,auStack_808._8_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_708._M_dataplus._M_p != &local_708.field_2) {
      operator_delete(local_708._M_dataplus._M_p,local_708.field_2._M_allocated_capacity + 1);
    }
    location::~location(&local_3c8);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )local_870);
    _Var12._M_p = local_6e8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6e8._M_dataplus._M_p == &local_6e8.field_2) goto LAB_003d8cca;
  }
  else {
    (loc->source_).
    super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = local_5c8.source_.
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(loc->source_).
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               &local_5c8.source_.
                super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&loc->source_name_,&local_5c8.source_name_);
    loc->column_number_ = local_5c8.column_number_;
    loc->location_ = CONCAT44(local_5c8.location_._4_4_,(undefined4)local_5c8.location_);
    loc->line_number_ = CONCAT44(local_5c8.line_number_._4_4_,(undefined4)local_5c8.line_number_);
    syntax::hex_floating((sequence *)local_878,&ctx->toml_spec_);
    sequence::scan((region *)local_810,(sequence *)local_878,loc);
    region::operator=(&local_638,(region *)local_810);
    region::~region((region *)local_810);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )local_870);
    if (local_638.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr != (element_type *)0x0) {
      puVar4 = ((local_638.source_.
                 super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_start;
      make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (&local_580,(detail *)(puVar4 + local_638.first_),
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(puVar4 + local_638.last_),in_RCX);
      parse_floating<toml::type_config>();
LAB_003d8d87:
      paVar1 = &local_898.field_2;
      local_8a8 = 0;
      pcStack_8a0 = (char *)0x0;
      local_898._M_string_length = 0;
      local_898.field_2._M_local_buf[0] = '\0';
      local_898._M_dataplus._M_p = (pointer)paVar1;
      if (SUB41(uVar14,0) == false) {
        local_810[0] = true;
        _Var8 = std::
                __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          (local_8d8._M_dataplus._M_p,
                           local_8d8._M_dataplus._M_p + local_8d8._M_string_length);
        if (_Var8._M_current == local_8d8._M_dataplus._M_p + local_8d8._M_string_length) {
          local_878[0] = true;
          _Var8 = std::
                  __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                            ();
          if (_Var8._M_current == local_8d8._M_dataplus._M_p + local_8d8._M_string_length) {
            local_8a8 = fixed;
            goto LAB_003d8e02;
          }
        }
        local_8a8 = scientific;
      }
      else {
        local_8a8 = hex;
      }
LAB_003d8e02:
      local_810[0] = true;
      _Var8 = std::
              __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                        ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )local_8d8._M_dataplus._M_p,
                         (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(local_8d8._M_dataplus._M_p + local_8d8._M_string_length),
                         (_Iter_equals_val<const_char>)local_810);
      local_8d8._M_string_length = (long)_Var8._M_current - (long)local_8d8._M_dataplus._M_p;
      *_Var8._M_current = '\0';
      iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(&local_8d8,"inf");
      local_8e0 = INFINITY;
      if ((iVar7 == 0) ||
         (iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  compare(&local_8d8,"+inf"), iVar7 == 0)) {
LAB_003d8f08:
        if ((ctx->toml_spec_).ext_num_suffix == true) {
          peVar5 = (loc->source_).
                   super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          last._M_current =
               (peVar5->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
          if ((loc->location_ <
               (ulong)((long)(peVar5->
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)last._M_current)) &&
             (last._M_current[loc->location_] == '_')) {
            syntax::num_suffix((sequence *)local_810,&ctx->toml_spec_);
            sequence::scan((region *)local_878,(sequence *)local_810,loc);
            std::
            vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
            ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                     *)auStack_808);
            plVar6 = (long *)CONCAT71(local_878._1_7_,local_878[0]);
            if (plVar6 == (long *)0x0) {
              region::region((region *)local_540,loc);
              source_location::source_location((source_location *)local_810,(region *)local_540);
              region::~region((region *)local_540);
              (loc->source_).
              super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr = local_5c8.source_.
                        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&(loc->source_).
                          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount,
                         &local_5c8.source_.
                          super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign(&loc->source_name_,&local_5c8.source_name_);
              loc->column_number_ = local_5c8.column_number_;
              *(undefined4 *)&loc->location_ = (undefined4)local_5c8.location_;
              *(undefined4 *)((long)&loc->location_ + 4) = local_5c8.location_._4_4_;
              *(undefined4 *)&loc->line_number_ = (undefined4)local_5c8.line_number_;
              *(undefined4 *)((long)&loc->line_number_ + 4) = local_5c8.line_number_._4_4_;
              local_728._M_dataplus._M_p = (pointer)&local_728.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_728,
                         "toml::parse_floating: invalid suffix: should be `_ non-digit-graph (graph | _graph)`"
                         ,"");
              local_4d8._1_7_ = local_810._1_7_;
              local_4d8.is_ok_ = local_810[0];
              local_4d8.file_name_._M_dataplus._M_p = (pointer)&local_4d8.file_name_.field_2;
              local_4d8.last_offset_._0_4_ = local_7f0[1]._0_4_;
              local_4d8.last_offset_._4_4_ = local_7f0[1]._4_4_;
              local_4d8.length_._0_4_ = local_7f0[1]._8_4_;
              local_4d8.length_._4_4_ = local_7f0[1]._12_4_;
              local_4d8.last_line_._0_4_ = (undefined4)local_7f0[0]._M_allocated_capacity;
              local_4d8.last_line_._4_4_ = local_7f0[0]._M_allocated_capacity._4_4_;
              local_4d8.last_column_._0_4_ = local_7f0[0]._8_4_;
              local_4d8.last_column_._4_4_ = local_7f0[0]._12_4_;
              local_4d8.first_column_._0_4_ = auStack_808._8_4_;
              local_4d8.first_column_._4_4_ = auStack_808._12_4_;
              local_4d8.first_offset_._0_4_ = auStack_808._16_4_;
              local_4d8.first_offset_._4_4_ = auStack_808._20_4_;
              local_4d8.first_line_ = auStack_808._0_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_7d0 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_7c8 + 8)) {
                local_4d8.file_name_.field_2._8_8_ = local_7c8._16_8_;
              }
              else {
                local_4d8.file_name_._M_dataplus._M_p = (pointer)local_7d0;
              }
              local_4d8.file_name_._M_string_length = local_7c8._0_8_;
              local_7c8._0_8_ = 0;
              local_7c8[8] = '\0';
              local_4d8.line_str_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = local_7b0;
              local_4d8.line_str_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)aaStack_7a8[0]._0_8_;
              local_4d8.line_str_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)aaStack_7a8[0]._8_8_;
              local_7b0 = (pointer)0x0;
              aaStack_7a8[0]._M_allocated_capacity = (pointer)0x0;
              aaStack_7a8[0]._8_8_ = (pointer)0x0;
              local_7d0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(local_7c8 + 8);
              local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_748,"here","");
              make_error_info<>((error_info *)local_540,&local_728,&local_4d8,&local_748);
              err<toml::error_info>(&local_138,(error_info *)local_540);
              local_8b8->is_ok_ = false;
              failure<toml::error_info>::failure
                        ((failure<toml::error_info> *)&(local_8b8->field_1).succ_,&local_138);
              failure<toml::error_info>::~failure(&local_138);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_508._M_p != local_4f8) {
                operator_delete(local_508._M_p,local_4f8[0]._M_allocated_capacity + 1);
              }
              std::
              vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_530 + 0x10));
              if ((element_type *)local_540._0_8_ != (element_type *)local_530) {
                operator_delete((void *)local_540._0_8_,(ulong)(local_530._0_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_748._M_dataplus._M_p != &local_748.field_2) {
                operator_delete(local_748._M_dataplus._M_p,
                                local_748.field_2._M_allocated_capacity + 1);
              }
              source_location::~source_location(&local_4d8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_728._M_dataplus._M_p != &local_728.field_2) {
                operator_delete(local_728._M_dataplus._M_p,
                                local_728.field_2._M_allocated_capacity + 1);
              }
              source_location::~source_location((source_location *)local_810);
            }
            else {
              make_string<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        ((string *)local_810,
                         (detail *)(&((source_location *)local_870._48_8_)->is_ok_ + *plVar6),
                         (uchar *)(*plVar6 + local_870._72_8_),last);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_808._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1) {
                __dest = (undefined1 *)CONCAT71(local_810._1_7_,local_810[0]);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_808._0_8_ ==
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2) {
                  *__dest = __dest[1];
                }
                else {
                  memmove(__dest,__dest + 1,(size_t)(auStack_808._0_8_ - 1));
                }
              }
              *(undefined1 *)(CONCAT71(local_810._1_7_,local_810[0]) + -1 + auStack_808._0_8_) = 0;
              auStack_808._0_8_ =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(auStack_808._0_8_ + -1);
              std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign(&local_898,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_810);
              if ((undefined1 *)CONCAT71(local_810._1_7_,local_810[0]) != auStack_808 + 8) {
                operator_delete((undefined1 *)CONCAT71(local_810._1_7_,local_810[0]),
                                CONCAT44(auStack_808._12_4_,auStack_808._8_4_) + 1);
              }
            }
            region::~region((region *)local_878);
            if (plVar6 == (long *)0x0) goto LAB_003d9628;
          }
        }
        local_668._1_7_ = uStack_8a7;
        local_668.fmt = local_8a8;
        paVar2 = &local_668.suffix.field_2;
        local_668.prec = (size_t)pcStack_8a0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_898._M_dataplus._M_p == paVar1) {
          local_668.suffix.field_2._8_8_ = local_898.field_2._8_8_;
          local_668.suffix._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_668.suffix._M_dataplus._M_p = local_898._M_dataplus._M_p;
        }
        local_668.suffix.field_2._M_allocated_capacity._1_7_ =
             local_898.field_2._M_allocated_capacity._1_7_;
        local_668.suffix.field_2._M_local_buf[0] = local_898.field_2._M_local_buf[0];
        local_668.suffix._M_string_length = local_898._M_string_length;
        local_898._M_string_length = 0;
        local_898.field_2._M_local_buf[0] = '\0';
        local_688.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_688.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_688.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        paVar3 = &local_638.source_name_.field_2;
        local_438.source_name_._M_dataplus._M_p = (pointer)&local_438.source_name_.field_2;
        local_438.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = local_638.source_.
                  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr;
        local_438.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi =
             local_638.source_.
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        local_638.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)0x0;
        local_638.source_.
        super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_638.source_name_._M_dataplus._M_p == paVar3) {
          local_438.source_name_.field_2._8_8_ = local_638.source_name_.field_2._8_8_;
        }
        else {
          local_438.source_name_._M_dataplus._M_p = local_638.source_name_._M_dataplus._M_p;
        }
        local_438.source_name_._M_string_length = local_638.source_name_._M_string_length;
        local_638.source_name_._M_string_length = 0;
        local_638.source_name_.field_2._M_local_buf[0] = '\0';
        local_438.length_ = local_638.length_;
        local_438.first_ = local_638.first_;
        local_438.first_line_ = local_638.first_line_;
        local_438.first_column_ = local_638.first_column_;
        local_438.last_ = local_638.last_;
        local_438.last_line_ = local_638.last_line_;
        local_438.last_column_ = local_638.last_column_;
        local_898._M_dataplus._M_p = (pointer)paVar1;
        local_638.source_name_._M_dataplus._M_p = (pointer)paVar3;
        basic_value<toml::type_config>::basic_value
                  ((basic_value<toml::type_config> *)local_810,local_8e0,&local_668,&local_688,
                   &local_438);
        ok<toml::basic_value<toml::type_config>>
                  ((success<toml::basic_value<toml::type_config>_> *)&local_200,(toml *)local_810,
                   v_00);
        local_8b8->is_ok_ = true;
        ctx_00 = &local_200;
        basic_value<toml::type_config>::basic_value(&(local_8b8->field_1).succ_.value,&local_200);
        basic_value<toml::type_config>::cleanup(&local_200,(EVP_PKEY_CTX *)ctx_00);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_200.comments_.comments);
        region::~region(&local_200.region_);
        basic_value<toml::type_config>::cleanup
                  ((basic_value<toml::type_config> *)local_810,(EVP_PKEY_CTX *)ctx_00);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&vStack_760);
        region::~region((region *)local_7c8);
        region::~region(&local_438);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_688);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_668.suffix._M_dataplus._M_p != paVar2) {
          operator_delete(local_668.suffix._M_dataplus._M_p,
                          local_668.suffix.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_8d8,"-inf");
        if (iVar7 == 0) {
          uVar15 = 0xfff00000;
LAB_003d8f02:
          local_8e0 = (floating_type)((ulong)uVar15 << 0x20);
          goto LAB_003d8f08;
        }
        iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_8d8,"nan");
        local_8e0 = NAN;
        if ((iVar7 == 0) ||
           (iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::compare(&local_8d8,"+nan"), iVar7 == 0)) goto LAB_003d8f08;
        iVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_8d8,"-nan");
        if (iVar7 == 0) {
          uVar15 = 0xfff80000;
          goto LAB_003d8f02;
        }
        if (local_8d8._M_string_length == 0) {
          lVar11 = 0;
        }
        else {
          lVar11 = -(ulong)((*local_8d8._M_dataplus._M_p - 0x2bU & 0xfd) == 0);
        }
        local_810[0] = true;
        _Var8 = std::
                __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          (local_8d8._M_dataplus._M_p,
                           local_8d8._M_dataplus._M_p + local_8d8._M_string_length);
        _Var9 = std::
                __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<toml::detail::parse_floating<toml::type_config>(toml::detail::location&,toml::detail::context<toml::type_config>const&)::_lambda(char)_1_>>
                          (local_8d8._M_dataplus._M_p,
                           local_8d8._M_dataplus._M_p + local_8d8._M_string_length);
        if (local_8a8 == scientific) {
          pcStack_8a0 = _Var9._M_current + (lVar11 - (long)local_8d8._M_dataplus._M_p);
          if (_Var8._M_current != local_8d8._M_dataplus._M_p + local_8d8._M_string_length) {
            pcStack_8a0 = pcStack_8a0 + -1;
          }
        }
        else {
          pcStack_8a0 = (char *)0x11;
          if (local_8a8 != hex) {
            pcStack_8a0 = _Var9._M_current + ~(ulong)_Var8._M_current;
          }
        }
        region::region((region *)local_878,loc);
        source_location::source_location((source_location *)local_810,(region *)local_878);
        region::~region((region *)local_878);
        source_location::source_location(&local_338,(source_location *)local_810);
        type_config::parse_float
                  ((result<double,_toml::error_info> *)local_878,&local_8d8,&local_338,
                   SUB41(uVar14,0));
        source_location::~source_location(&local_338);
        bVar13 = local_878[0];
        if (local_878[0] == true) {
          uVar14 = (undefined4)local_870._0_8_;
          uVar16 = SUB84(local_870._0_8_,4);
        }
        else {
          err<toml::error_info_const&>(&local_258,(toml *)local_870,v);
          local_8b8->is_ok_ = false;
          failure<toml::error_info>::failure
                    ((failure<toml::error_info> *)&(local_8b8->field_1).succ_,&local_258);
          failure<toml::error_info>::~failure(&local_258);
          uVar14 = 0;
          uVar16 = 0;
        }
        local_8e0 = (floating_type)CONCAT44(uVar16,uVar14);
        if (local_878[0] == false) {
          failure<toml::error_info>::~failure((failure<toml::error_info> *)local_870);
        }
        source_location::~source_location((source_location *)local_810);
        if (bVar13 != false) goto LAB_003d8f08;
      }
LAB_003d9628:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_898._M_dataplus._M_p != paVar1) {
        operator_delete(local_898._M_dataplus._M_p,
                        CONCAT71(local_898.field_2._M_allocated_capacity._1_7_,
                                 local_898.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_003d8cca;
    }
    local_6a8._M_dataplus._M_p = (pointer)&local_6a8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_6a8,
               "toml::parse_floating: invalid hex floating: float must be like: 0xABCp-3f","");
    syntax::floating((either *)local_878,&ctx->toml_spec_);
    location::location(&local_380,loc);
    local_6c8._M_dataplus._M_p = (pointer)&local_6c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c8,"");
    make_syntax_error<toml::detail::either>
              ((error_info *)local_810,&local_6a8,(either *)local_878,&local_380,&local_6c8);
    err<toml::error_info>(&local_88,(error_info *)local_810);
    local_8b8->is_ok_ = false;
    failure<toml::error_info>::failure
              ((failure<toml::error_info> *)&(local_8b8->field_1).succ_,&local_88);
    failure<toml::error_info>::~failure(&local_88);
    if ((undefined1 *)CONCAT44(local_7f0[1]._12_4_,local_7f0[1]._8_4_) != local_7c8) {
      operator_delete((undefined1 *)CONCAT44(local_7f0[1]._12_4_,local_7f0[1]._8_4_),
                      local_7c8._0_8_ + 1);
    }
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_7f0);
    if ((undefined1 *)CONCAT71(local_810._1_7_,local_810[0]) != auStack_808 + 8) {
      operator_delete((undefined1 *)CONCAT71(local_810._1_7_,local_810[0]),
                      CONCAT44(auStack_808._12_4_,auStack_808._8_4_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6c8._M_dataplus._M_p != &local_6c8.field_2) {
      operator_delete(local_6c8._M_dataplus._M_p,local_6c8.field_2._M_allocated_capacity + 1);
    }
    location::~location(&local_380);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )local_870);
    local_6e8.field_2._M_allocated_capacity = local_6a8.field_2._M_allocated_capacity;
    _Var12._M_p = local_6a8._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_6a8._M_dataplus._M_p == &local_6a8.field_2) goto LAB_003d8cca;
  }
  operator_delete(_Var12._M_p,local_6e8.field_2._M_allocated_capacity + 1);
LAB_003d8cca:
  region::~region(&local_638);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != &local_8d8.field_2) {
    operator_delete(local_8d8._M_dataplus._M_p,
                    CONCAT71(local_8d8.field_2._M_allocated_capacity._1_7_,
                             local_8d8.field_2._M_local_buf[0]) + 1);
  }
  location::~location(&local_5c8);
  return local_8b8;
}

Assistant:

result<basic_value<TC>, error_info>
parse_floating(location& loc, const context<TC>& ctx)
{
    using floating_type = typename basic_value<TC>::floating_type;

    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    // ----------------------------------------------------------------------
    // check syntax
    bool is_hex = false;
    std::string str;
    region reg;
    if(spec.ext_hex_float && sequence(character('0'), character('x')).scan(loc).is_ok())
    {
        loc = first;
        is_hex = true;

        reg = syntax::hex_floating(spec).scan(loc);
        if( ! reg.is_ok())
        {
            return err(make_syntax_error("toml::parse_floating: "
                "invalid hex floating: float must be like: 0xABCp-3f",
                syntax::floating(spec), loc));
        }
        str = reg.as_string();
    }
    else
    {
        reg = syntax::floating(spec).scan(loc);
        if( ! reg.is_ok())
        {
            return err(make_syntax_error("toml::parse_floating: "
                "invalid floating: float must be like: -3.14159_26535, 6.022e+23, "
                "inf, or nan (lowercase).", syntax::floating(spec), loc));
        }
        str = reg.as_string();
    }

    // ----------------------------------------------------------------------
    // it matches. gen value

    floating_format_info fmt;

    if(is_hex)
    {
        fmt.fmt = floating_format::hex;
    }
    else
    {
        // since we already checked that the string conforms the TOML standard.
        if(std::find(str.begin(), str.end(), 'e') != str.end() ||
           std::find(str.begin(), str.end(), 'E') != str.end())
        {
            fmt.fmt = floating_format::scientific; // use exponent part
        }
        else
        {
            fmt.fmt = floating_format::fixed; // do not use exponent part
        }
    }

    str.erase(std::remove(str.begin(), str.end(), '_'), str.end());

    floating_type val{0};

    if(str == "inf" || str == "+inf")
    {
        TOML11_CONSTEXPR_IF(std::numeric_limits<floating_type>::has_infinity)
        {
            val = std::numeric_limits<floating_type>::infinity();
        }
        else
        {
            return err(make_error_info("toml::parse_floating: inf value found"
                " but the current environment does not support inf. Please"
                " make sure that the floating-point implementation conforms"
                " IEEE 754/ISO 60559 international standard.",
                source_location(region(loc)),
                "floating_type: inf is not supported"));
        }
    }